

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_compact(REF_CELL ref_cell,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_INT *pRVar4;
  REF_INT *__s;
  REF_INT *pRVar5;
  int *piVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  
  iVar1 = ref_cell->max;
  uVar8 = (ulong)iVar1;
  if ((long)uVar8 < 0) {
    pcVar12 = "malloc *o2n_ptr of REF_INT negative";
    uVar7 = 0x357;
  }
  else {
    __s = (REF_INT *)malloc(uVar8 * 4);
    *o2n_ptr = __s;
    if (__s == (REF_INT *)0x0) {
      pcVar12 = "malloc *o2n_ptr of REF_INT NULL";
      uVar7 = 0x357;
LAB_001e5595:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar7,
             "ref_cell_compact",pcVar12);
      return 2;
    }
    if (iVar1 != 0) {
      memset(__s,0xff,uVar8 * 4);
    }
    iVar2 = ref_cell->n;
    if ((long)iVar2 < 0) {
      pcVar12 = "malloc *n2o_ptr of REF_INT negative";
      uVar7 = 0x359;
    }
    else {
      pRVar5 = (REF_INT *)malloc((long)iVar2 * 4);
      *n2o_ptr = pRVar5;
      if (pRVar5 == (REF_INT *)0x0) {
        pcVar12 = "malloc *n2o_ptr of REF_INT NULL";
        uVar7 = 0x359;
        goto LAB_001e5595;
      }
      if (iVar1 == 0) {
        if (iVar2 == 0) {
          return 0;
        }
      }
      else {
        pRVar4 = ref_cell->c2n;
        iVar3 = ref_cell->size_per;
        iVar9 = 0;
        uVar11 = 0;
        iVar10 = 0;
        do {
          if (pRVar4[iVar9] != -1) {
            __s[uVar11] = iVar10;
            iVar10 = iVar10 + 1;
          }
          uVar11 = uVar11 + 1;
          iVar9 = iVar9 + iVar3;
        } while (uVar11 < uVar8);
        if (iVar10 == iVar2) {
          if (iVar1 == 0) {
            return 0;
          }
          piVar6 = ref_cell->c2n;
          iVar1 = ref_cell->size_per;
          uVar11 = 0;
          do {
            if (*piVar6 != -1) {
              pRVar5[__s[uVar11]] = (REF_INT)uVar11;
            }
            uVar11 = uVar11 + 1;
            piVar6 = piVar6 + iVar1;
          } while (uVar8 != uVar11);
          return 0;
        }
      }
      pcVar12 = "ncell miscount";
      uVar7 = 0x363;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar7,
         "ref_cell_compact",pcVar12);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_compact(REF_CELL ref_cell, REF_INT **o2n_ptr,
                                    REF_INT **n2o_ptr) {
  REF_INT cell;
  REF_INT ncell;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_cell_n(ref_cell), REF_INT);
  n2o = *n2o_ptr;

  ncell = 0;

  each_ref_cell_valid_cell(ref_cell, cell) {
    o2n[cell] = ncell;
    ncell++;
  }

  RES(ncell, ref_cell_n(ref_cell), "ncell miscount");

  each_ref_cell_valid_cell(ref_cell, cell) n2o[o2n[cell]] = cell;

  return REF_SUCCESS;
}